

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall
QString::section(QString *this,QString *sep,qsizetype start,qsizetype end,SectionFlags flags)

{
  QStringView v;
  QStringView sep_00;
  bool bVar1;
  byte bVar2;
  qsizetype qVar3;
  const_reference pQVar4;
  long in_RCX;
  QStringView *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  bool empty;
  QStringView *section;
  qsizetype i;
  qsizetype x;
  qsizetype last_i;
  qsizetype first_i;
  qsizetype k;
  qsizetype skip;
  qsizetype sectionsSize;
  QString *ret;
  QList<QStringView> sections;
  undefined4 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefd;
  undefined1 uVar5;
  byte in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  undefined1 uVar6;
  QStringView *this_00;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  undefined8 in_stack_ffffffffffffff48;
  QFlagsStorage<Qt::SplitBehaviorFlags> behavior;
  long lVar7;
  storage_type_conflict *in_stack_ffffffffffffff50;
  long lVar8;
  qsizetype in_stack_ffffffffffffff58;
  long local_a0;
  long local_98;
  QFlagsStorageHelper<QString::SectionFlag,_4> local_74;
  QFlagsStorageHelper<QString::SectionFlag,_4> local_70;
  QFlagsStorageHelper<QString::SectionFlag,_4> local_6c;
  storage_type_conflict *local_68;
  qsizetype local_60;
  QFlagsStorageHelper<QString::SectionFlag,_4> local_54;
  QFlagsStorageHelper<QString::SectionFlag,_4> local_50;
  QList<QStringView> local_28;
  long local_8;
  
  behavior.i = (Int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (QStringView *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
             (QString *)in_RDI);
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
             (QString *)this_00);
  QFlags<Qt::SplitBehaviorFlags>::QFlags
            ((QFlags<Qt::SplitBehaviorFlags> *)in_RDI,
             CONCAT13(in_stack_fffffffffffffeff,
                      CONCAT12(in_stack_fffffffffffffefe,
                               CONCAT11(in_stack_fffffffffffffefd,in_stack_fffffffffffffefc))));
  local_50.super_QFlagsStorage<QString::SectionFlag>.i =
       (QFlagsStorage<QString::SectionFlag>)
       QFlags<QString::SectionFlag>::operator&
                 ((QFlags<QString::SectionFlag> *)in_RDI,
                  CONCAT13(in_stack_fffffffffffffeff,
                           CONCAT12(in_stack_fffffffffffffefe,
                                    CONCAT11(in_stack_fffffffffffffefd,in_stack_fffffffffffffefc))))
  ;
  ::QFlags::operator_cast_to_bool((QFlags *)&local_50);
  sep_00.m_size = in_stack_ffffffffffffff58;
  sep_00.m_data = in_stack_ffffffffffffff50;
  QStringView::split(this_00,sep_00,(SplitBehavior)behavior.i,
                     (CaseSensitivity)((ulong)in_RDI >> 0x20));
  qVar3 = QList<QStringView>::size(&local_28);
  local_54.super_QFlagsStorage<QString::SectionFlag>.i =
       (QFlagsStorage<QString::SectionFlag>)
       QFlags<QString::SectionFlag>::operator&
                 ((QFlags<QString::SectionFlag> *)in_RDI,
                  CONCAT13(in_stack_fffffffffffffeff,
                           CONCAT12(in_stack_fffffffffffffefe,
                                    CONCAT11(in_stack_fffffffffffffefd,in_stack_fffffffffffffefc))))
  ;
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_54);
  local_a0 = in_R8;
  local_98 = in_RCX;
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    lVar8 = 0;
    for (lVar7 = 0; lVar7 < qVar3; lVar7 = lVar7 + 1) {
      QList<QStringView>::at
                ((QList<QStringView> *)in_RDI,
                 CONCAT17(in_stack_fffffffffffffeff,
                          CONCAT16(in_stack_fffffffffffffefe,
                                   CONCAT15(in_stack_fffffffffffffefd,
                                            CONCAT14(in_stack_fffffffffffffefc,
                                                     in_stack_fffffffffffffef8)))));
      bVar1 = QStringView::isEmpty((QStringView *)0x1d7172);
      if (bVar1) {
        lVar8 = lVar8 + 1;
      }
    }
    if (in_RCX < 0) {
      local_98 = (qVar3 - lVar8) + in_RCX;
    }
    if (in_R8 < 0) {
      local_a0 = (qVar3 - lVar8) + in_R8;
    }
  }
  else {
    if (in_RCX < 0) {
      local_98 = qVar3 + in_RCX;
    }
    if (in_R8 < 0) {
      local_a0 = qVar3 + in_R8;
    }
  }
  if (((local_98 < qVar3) && (-1 < local_a0)) && (local_98 <= local_a0)) {
    ((DataPointer *)&in_RDI->m_data)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    in_RDI->m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    in_RDI[1].m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    QString((QString *)0x1d7238);
    local_c8 = local_98;
    local_d0 = local_a0;
    local_d8 = 0;
    for (local_e0 = 0; uVar6 = local_d8 <= local_a0 && local_e0 < qVar3,
        local_d8 <= local_a0 && local_e0 < qVar3; local_e0 = local_e0 + 1) {
      pQVar4 = QList<QStringView>::at
                         ((QList<QStringView> *)in_RDI,
                          CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffefe,
                                                  CONCAT15(in_stack_fffffffffffffefd,
                                                           CONCAT14(in_stack_fffffffffffffefc,
                                                                    in_stack_fffffffffffffef8)))));
      bVar2 = QStringView::isEmpty((QStringView *)0x1d72be);
      if (local_98 <= local_d8) {
        if (local_d8 == local_98) {
          local_c8 = local_e0;
        }
        if (local_d8 == local_a0) {
          local_d0 = local_e0;
        }
        if ((local_98 < local_d8) && (0 < local_e0)) {
          operator+=((QString *)in_RDI,
                     (QString *)
                     CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffefe,
                                             CONCAT15(in_stack_fffffffffffffefd,
                                                      CONCAT14(in_stack_fffffffffffffefc,
                                                               in_stack_fffffffffffffef8)))));
        }
        local_68 = pQVar4->m_data;
        local_60 = pQVar4->m_size;
        v.m_data._7_1_ = bVar2;
        v.m_data._0_7_ = in_stack_ffffffffffffff10;
        v.m_size = (qsizetype)pQVar4;
        operator+=((QString *)
                   CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffefe,
                                           CONCAT15(in_stack_fffffffffffffefd,
                                                    CONCAT14(in_stack_fffffffffffffefc,
                                                             in_stack_fffffffffffffef8)))),v);
      }
      in_stack_fffffffffffffefe = 1;
      if ((bVar2 & 1) != 0) {
        local_6c.super_QFlagsStorage<QString::SectionFlag>.i =
             (QFlagsStorage<QString::SectionFlag>)
             QFlags<QString::SectionFlag>::operator&
                       ((QFlags<QString::SectionFlag> *)in_RDI,
                        CONCAT13(uVar6,CONCAT12(1,CONCAT11(in_stack_fffffffffffffefd,
                                                           in_stack_fffffffffffffefc))));
        bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_6c);
        in_stack_fffffffffffffefe = bVar1 ^ 0xff;
      }
      if ((in_stack_fffffffffffffefe & 1) != 0) {
        local_d8 = local_d8 + 1;
      }
    }
    local_70.super_QFlagsStorage<QString::SectionFlag>.i =
         (QFlagsStorage<QString::SectionFlag>)
         QFlags<QString::SectionFlag>::operator&
                   ((QFlags<QString::SectionFlag> *)in_RDI,
                    CONCAT13(uVar6,CONCAT12(in_stack_fffffffffffffefe,
                                            CONCAT11(in_stack_fffffffffffffefd,
                                                     in_stack_fffffffffffffefc))));
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_70);
    uVar5 = bVar1 && 0 < local_c8;
    if ((bool)uVar5) {
      prepend((QString *)in_RDI,
              (QString *)
              CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffefe,
                                      CONCAT15(uVar5,CONCAT14(in_stack_fffffffffffffefc,
                                                              in_stack_fffffffffffffef8)))));
    }
    local_74.super_QFlagsStorage<QString::SectionFlag>.i =
         (QFlagsStorage<QString::SectionFlag>)
         QFlags<QString::SectionFlag>::operator&
                   ((QFlags<QString::SectionFlag> *)in_RDI,
                    CONCAT13(uVar6,CONCAT12(in_stack_fffffffffffffefe,
                                            CONCAT11(uVar5,in_stack_fffffffffffffefc))));
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_74);
    bVar1 = bVar1 && local_d0 < qVar3 + -1;
    if (bVar1) {
      operator+=((QString *)in_RDI,
                 (QString *)
                 CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffefe,
                                         CONCAT15(uVar5,CONCAT14(bVar1,in_stack_fffffffffffffef8))))
                );
    }
  }
  else {
    QString((QString *)0x1d71fc);
  }
  QList<QStringView>::~QList((QList<QStringView> *)0x1d74ad);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)this_00;
}

Assistant:

QString QString::section(const QString &sep, qsizetype start, qsizetype end, SectionFlags flags) const
{
    const QList<QStringView> sections = QStringView{ *this }.split(
            sep, Qt::KeepEmptyParts, (flags & SectionCaseInsensitiveSeps) ? Qt::CaseInsensitive : Qt::CaseSensitive);
    const qsizetype sectionsSize = sections.size();
    if (!(flags & SectionSkipEmpty)) {
        if (start < 0)
            start += sectionsSize;
        if (end < 0)
            end += sectionsSize;
    } else {
        qsizetype skip = 0;
        for (qsizetype k = 0; k < sectionsSize; ++k) {
            if (sections.at(k).isEmpty())
                skip++;
        }
        if (start < 0)
            start += sectionsSize - skip;
        if (end < 0)
            end += sectionsSize - skip;
    }
    if (start >= sectionsSize || end < 0 || start > end)
        return QString();

    QString ret;
    qsizetype first_i = start, last_i = end;
    for (qsizetype x = 0, i = 0; x <= end && i < sectionsSize; ++i) {
        const QStringView &section = sections.at(i);
        const bool empty = section.isEmpty();
        if (x >= start) {
            if (x == start)
                first_i = i;
            if (x == end)
                last_i = i;
            if (x > start && i > 0)
                ret += sep;
            ret += section;
        }
        if (!empty || !(flags & SectionSkipEmpty))
            x++;
    }
    if ((flags & SectionIncludeLeadingSep) && first_i > 0)
        ret.prepend(sep);
    if ((flags & SectionIncludeTrailingSep) && last_i < sectionsSize - 1)
        ret += sep;
    return ret;
}